

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

int zmq_ctx_set_ext(void *ctx_,int option_,void *optval_,size_t optvallen_)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ctx_t *in_RDI;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  int in_stack_00000034;
  ctx_t *in_stack_00000038;
  
  if ((in_RDI != (ctx_t *)0x0) && (bVar1 = zmq::ctx_t::check_tag(in_RDI), bVar1)) {
    iVar2 = zmq::ctx_t::set(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020)
    ;
    return iVar2;
  }
  piVar3 = __errno_location();
  *piVar3 = 0xe;
  return -1;
}

Assistant:

int zmq_ctx_set_ext (void *ctx_,
                     int option_,
                     const void *optval_,
                     size_t optvallen_)
{
    if (!ctx_ || !(static_cast<zmq::ctx_t *> (ctx_))->check_tag ()) {
        errno = EFAULT;
        return -1;
    }
    return (static_cast<zmq::ctx_t *> (ctx_))
      ->set (option_, optval_, optvallen_);
}